

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O0

void color_quantize(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,int num_rows)

{
  JDIMENSION JVar1;
  int iVar2;
  _func_void_j_decompress_ptr *p_Var3;
  int nc;
  JDIMENSION width;
  JDIMENSION col;
  int row;
  JSAMPROW ptrout;
  JSAMPROW ptrin;
  int ci;
  int pixcode;
  JSAMPARRAY colorindex;
  my_cquantize_ptr cquantize;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  JSAMPARRAY input_buf_local;
  j_decompress_ptr cinfo_local;
  
  p_Var3 = cinfo->cquantize[1].finish_pass;
  JVar1 = cinfo->output_width;
  iVar2 = cinfo->out_color_components;
  for (row = 0; row < num_rows; row = row + 1) {
    ptrin = input_buf[row];
    ptrout = output_buf[row];
    for (col = JVar1; col != 0; col = col - 1) {
      pixcode = 0;
      for (ci = 0; ci < iVar2; ci = ci + 1) {
        pixcode = (uint)*(byte *)(*(long *)(p_Var3 + (long)ci * 8) + (ulong)*ptrin) + pixcode;
        ptrin = ptrin + 1;
      }
      *ptrout = (JSAMPLE)pixcode;
      ptrout = ptrout + 1;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
color_quantize(j_decompress_ptr cinfo, JSAMPARRAY input_buf,
               JSAMPARRAY output_buf, int num_rows)
/* General case, no dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  JSAMPARRAY colorindex = cquantize->colorindex;
  register int pixcode, ci;
  register JSAMPROW ptrin, ptrout;
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;
  register int nc = cinfo->out_color_components;

  for (row = 0; row < num_rows; row++) {
    ptrin = input_buf[row];
    ptrout = output_buf[row];
    for (col = width; col > 0; col--) {
      pixcode = 0;
      for (ci = 0; ci < nc; ci++) {
        pixcode += colorindex[ci][*ptrin++];
      }
      *ptrout++ = (JSAMPLE)pixcode;
    }
  }
}